

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::Node::End(Node *this,StreamWriterLE *s,bool binary,int indent,bool has_children)

{
  long lVar1;
  undefined7 in_register_00000011;
  Node *this_00;
  ostringstream ss;
  string local_1b8;
  Node local_198;
  ios_base local_128 [264];
  
  if ((int)CONCAT71(in_register_00000011,binary) != 0) {
    EndBinary(this,s,has_children);
    return;
  }
  this_00 = &local_198;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  EndAscii(this_00,(ostream *)&local_198,indent,has_children);
  lVar1 = std::ostream::tellp();
  if (0 < lVar1) {
    std::__cxx11::stringbuf::str();
    StreamWriter<false,_false>::PutString(s,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void FBX::Node::End(
    Assimp::StreamWriterLE &s,
    bool binary, int indent,
    bool has_children
) {
    if (binary) {
        EndBinary(s, has_children);
    } else {
        std::ostringstream ss;
        EndAscii(ss, indent, has_children);
        if (ss.tellp() > 0)
            s.PutString(ss.str());
    }
}